

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O3

void Sbc_ManDelayTrace(Gia_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  void *__s;
  uint uVar7;
  Vec_Int_t *pVVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  int iVar13;
  long lVar14;
  size_t __size;
  ulong uVar15;
  int *pLevels;
  uint local_68;
  uint local_64;
  int *local_60;
  Vec_Int_t *local_58;
  uint local_50;
  uint local_4c;
  Gia_Man_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  iVar13 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  if (iVar13 == 0) {
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar13 << 2;
    __s = malloc(__size);
  }
  memset(__s,0,__size);
  if (p->vMapping == (Vec_Int_t *)0x0) {
    puts("No mapping is available.");
    return;
  }
  iVar13 = iVar13 * 0x20;
  uVar6 = Gia_ManLutLevel(p,&local_60);
  uVar15 = (ulong)p->vCos->nSize;
  if ((long)uVar15 < 1) {
    uVar10 = p->nObjs;
  }
  else {
    piVar4 = p->vCos->pArray;
    uVar11 = 0;
    do {
      iVar9 = piVar4[uVar11];
      if (((long)iVar9 < 0) || (uVar10 = p->nObjs, (int)uVar10 <= iVar9)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar7 = iVar9 - (*(uint *)(p->pObjs + iVar9) & 0x1fffffff);
      if (local_60[(int)uVar7] == uVar6) {
        if (((int)uVar7 < 0) || (iVar13 <= (int)uVar7)) {
LAB_0054f5c2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s + (ulong)(uVar7 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar7 & 0x1f);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar15);
  }
  local_50 = uVar6;
  if ((int)uVar10 < 2) {
    uVar6 = 0;
    local_68 = 0;
    local_64 = 0;
    iVar9 = 0;
  }
  else {
    local_58 = p->vMapping;
    local_38 = (Vec_Int_t *)(ulong)uVar10;
    uVar7 = local_58->nSize;
    uVar6 = 0;
    local_68 = 0;
    local_64 = 0;
    pVVar8 = local_38;
    do {
      local_48 = p;
      if ((long)(int)uVar7 < (long)pVVar8) goto LAB_0054f584;
      pVVar12 = (Vec_Int_t *)((long)&pVVar8[-1].pArray + 7);
      uVar2 = local_58->pArray[(long)pVVar12];
      if ((ulong)uVar2 != 0) {
        if ((long)iVar13 < (long)pVVar8) {
LAB_0054f5a3:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        local_64 = local_64 + 1;
        if ((*(uint *)((long)__s + ((ulong)pVVar12 >> 5) * 4) >> ((uint)pVVar12 & 0x1f) & 1) != 0) {
          if (uVar7 <= uVar2 || (int)uVar2 < 0) goto LAB_0054f584;
          local_68 = local_68 + 1;
          piVar4 = local_58->pArray + uVar2;
          lVar14 = 0;
          while (lVar14 < *piVar4) {
            uVar3 = piVar4[lVar14 + 1];
            if (local_60[(long)pVVar12] <= local_60[(int)uVar3] + 1) {
              if (local_60[(int)uVar3] + 1 != local_60[(long)pVVar12]) {
                __assert_fail("pLevels[iFan] + 1 == pLevels[i]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdPath.c"
                              ,0xaf,"void Sbc_ManDelayTrace(Gia_Man_t *)");
              }
              if (((int)uVar3 < 0) || (iVar13 <= (int)uVar3)) goto LAB_0054f5c2;
              puVar1 = (uint *)((long)__s + (ulong)(uVar3 >> 5) * 4);
              *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
              uVar6 = uVar6 + 1;
            }
            lVar14 = lVar14 + 1;
            if (uVar7 <= uVar2 || (int)uVar2 < 0) goto LAB_0054f584;
          }
        }
      }
      bVar5 = 2 < (long)pVVar8;
      pVVar8 = pVVar12;
    } while (bVar5);
    if ((int)uVar10 < 2) {
      iVar9 = 0;
    }
    else {
      local_40 = p->vMapping;
      local_4c = local_40->nSize;
      local_58 = (Vec_Int_t *)0x1;
      if (1 < (int)local_4c) {
        local_58 = (Vec_Int_t *)(ulong)local_4c;
      }
      pVVar8 = (Vec_Int_t *)0x1;
      iVar9 = 0;
      do {
        if (pVVar8 == local_58) {
LAB_0054f584:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar4 = local_40->pArray;
        uVar10 = piVar4[(long)pVVar8];
        uVar15 = (ulong)uVar10;
        if (uVar15 != 0) {
          if (((int)uVar10 < 0) || (local_4c <= uVar10)) goto LAB_0054f584;
          uVar10 = piVar4[uVar15];
          uVar7 = uVar10;
          if ((int)uVar10 < 1) {
            uVar7 = 0;
          }
          if (0 < (int)uVar10) {
            uVar11 = 0;
            do {
              if ((long)iVar13 <= (long)pVVar8) goto LAB_0054f5a3;
              if ((*(uint *)((long)__s + ((ulong)pVVar8 >> 5 & 0x7ffffff) * 4) &
                  1 << ((byte)pVVar8 & 0x1f)) == 0) {
                uVar10 = 0;
              }
              else {
                uVar10 = piVar4[uVar15 + uVar11 + 1];
                if (((int)uVar10 < 0) || (iVar13 <= (int)uVar10)) goto LAB_0054f5a3;
                uVar10 = (uint)((*(uint *)((long)__s + (ulong)(uVar10 >> 5) * 4) >> (uVar10 & 0x1f)
                                & 1) != 0);
              }
              iVar9 = iVar9 + uVar10;
              uVar11 = uVar11 + 1;
            } while (uVar7 != uVar11);
          }
        }
        pVVar8 = (Vec_Int_t *)((long)&pVVar8->nCap + 1);
      } while (pVVar8 != local_38);
    }
  }
  if (local_60 != (int *)0x0) {
    free(local_60);
    local_60 = (int *)0x0;
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n",
         (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),(ulong)local_64,
         (ulong)local_50,(ulong)local_68,(ulong)uVar6,iVar9);
  return;
}

Assistant:

void Sbc_ManDelayTrace( Gia_Man_t * p )
{
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, iFan, nLevels, * pLevels;
    int nLuts = 0, nNodes = 0, nEdges = 0, nEdgesAll = 0;
    if ( !Gia_ManHasMapping(p) )
    {
        printf( "No mapping is available.\n" );
        return;
    }
    assert( Gia_ManHasMapping(p) );
    // set critical CO drivers
    nLevels = Gia_ManLutLevel( p, &pLevels );
    Gia_ManForEachCoDriverId( p, iFan, i )
        if ( pLevels[iFan] == nLevels )
            Vec_BitWriteEntry( vPath, iFan, 1 );
    // set critical internal nodes
    Gia_ManForEachLutReverse( p, i )
    { 
        nLuts++;
        if ( !Vec_BitEntry(vPath, i) )
            continue;
        nNodes++;
        Gia_LutForEachFanin( p, i, iFan, k )
        {
            if ( pLevels[iFan] +1 < pLevels[i] )
                continue;
            assert( pLevels[iFan] + 1 == pLevels[i] );
            Vec_BitWriteEntry( vPath, iFan, 1 );
            nEdges++;
            //printf( "%d -> %d\n", i, iFan );
        }
    }
    Gia_ManForEachLut( p, i )
        Gia_LutForEachFanin( p, i, iFan, k )
            nEdgesAll += (Vec_BitEntry(vPath, i) && Vec_BitEntry(vPath, iFan));

    ABC_FREE( pLevels );
    Vec_BitFree( vPath );
    printf( "AIG = %d. LUT = %d. Lev = %d.   Path nodes = %d.  Path edges = %d. (%d.)\n", 
        Gia_ManAndNum(p), nLuts, nLevels, nNodes, nEdges, nEdgesAll );
}